

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bdshemu_x86.c
# Opt level: O2

SHEMU_STATUS ShemuX86SetOperandValue(SHEMU_CONTEXT *Context,ND_UINT32 Operand,SHEMU_VALUE *Value)

{
  byte *pbVar1;
  PND_OPERAND Operand_00;
  char cVar2;
  ND_UINT8 NVar3;
  ushort uVar4;
  ND_REG_TYPE NVar5;
  int iVar6;
  sbyte sVar7;
  anon_union_64_7_0f5ec58a_for_Value *paVar8;
  ND_BOOL NVar9;
  SHEMU_STATUS SVar10;
  ND_UINT64 NVar11;
  ulong uVar12;
  uint uVar13;
  uint uVar14;
  ND_UINT64 Start;
  ND_SIZET n;
  ND_UINT64 NVar15;
  ND_UINT8 *pNVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  byte local_39;
  long lStack_38;
  uchar c;
  
  lStack_38 = *(long *)(in_FS_OFFSET + 0x28);
  Operand_00 = (PND_OPERAND)((long)&Context->Arch + (ulong)Operand * 0x20 + 0x40);
  NVar9 = ShemuIsStackPtr(Context,(Value->Value).Qwords[0],(ulong)Context->StrThreshold);
  if (NVar9 != '\0') {
    NVar11 = (Value->Value).Qwords[0];
    for (uVar17 = 0; uVar14 = Context->StrThreshold, uVar17 < uVar14; uVar17 = uVar17 + 1) {
      SVar10 = ShemuMemLoad(Context,NVar11 + uVar17,1,&local_39);
      if ((SVar10 != 0) ||
         ((((0xb < (byte)(local_39 - 0x2f) && (0x19 < (byte)((local_39 & 0xdf) + 0xbf))) &&
           (local_39 != 0x20)) && (local_39 != 0x5c)))) {
        uVar14 = Context->StrThreshold;
        break;
      }
    }
    if (uVar14 <= (uint)uVar17) {
      *(byte *)&Context->Flags = (byte)Context->Flags | 0x20;
    }
  }
  if ((*(byte *)Operand_00 & 0xf) == 2) {
    NVar11 = ShemuX86ComputeLinearAddress(Context,Operand_00);
    NVar9 = ShemuIsShellcodePtr(Context,NVar11,(ulong)Operand_00->Size);
    if (NVar9 != '\0') {
      pNVar16 = (ND_UINT8 *)0x0;
      NVar15 = 0;
      if ((Context->Options & 0x20) == 0) {
        NVar15 = Context->ShellcodeSize;
        pNVar16 = Context->Intbuf + Context->StackSize;
      }
      ShemuBmpStateUpdate(pNVar16,NVar15,NVar11 - Context->ShellcodeBase,(ulong)Operand_00->Size,
                          '\x01','\0');
    }
    uVar14 = *(uint *)((long)&Context->Arch + 0xc) & 0xf;
    if (uVar14 < Operand_00->Size) {
      uVar14 = Operand_00->Size;
    }
    NVar9 = ShemuIsStackPtr(Context,NVar11,(ulong)uVar14);
    if (NVar9 != '\0') {
      iVar6 = *(int *)((long)&Context->Arch + 0x1a8);
      if (iVar6 - 0x49U < 2) {
        pNVar16 = Context->Intbuf;
        NVar15 = Context->StackSize;
        Start = NVar11 - Context->StackBase;
LAB_00162d3d:
        uVar17 = (ulong)((uint)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf);
LAB_00162d44:
        NVar9 = '\0';
      }
      else {
        if (iVar6 - 0x10dU < 2) {
          pNVar16 = Context->Intbuf;
          NVar15 = Context->StackSize;
          Start = (NVar11 - Context->StackBase) + 8;
          goto LAB_00162d3d;
        }
        if (iVar6 == 0xed) {
          pNVar16 = Context->Intbuf;
          NVar15 = Context->StackSize;
          Start = (NVar11 - Context->StackBase) + 0xc;
          uVar12 = (ulong)((uint)*(undefined8 *)((long)&Context->Arch + 0xc) & 0xf);
          uVar17 = 4;
          if (uVar12 < 4) {
            uVar17 = uVar12;
          }
          goto LAB_00162d44;
        }
        pNVar16 = Context->Intbuf;
        NVar15 = Context->StackSize;
        Start = NVar11 - Context->StackBase;
        uVar17 = (ulong)Operand_00->Size;
        NVar9 = '\x01';
      }
      ShemuBmpStateUpdate(pNVar16,NVar15,Start,uVar17,'\x01',NVar9);
    }
    uVar14 = Value->Size;
    if (Operand_00->Size < Value->Size) {
      uVar14 = Operand_00->Size;
    }
    SVar10 = ShemuMemStore(Context,NVar11,(ulong)uVar14,(ND_UINT8 *)Value);
    if (SVar10 != 0) goto switchD_00162bbd_caseD_3;
    if ((Context->Options & 8) != 0) {
      ShemuDisplayMemValue(Context,NVar11,(ulong)Value->Size,(ND_UINT8 *)Value,'\0');
    }
    uVar4 = *(ushort *)&Operand_00->Info;
    if ((char)uVar4 < '\0') {
      NVar11 = ShemuX86GetGprValue(Context,4,2 << (*(byte *)&Context->Arch >> 4 & 3),'\0');
      ShemuX86SetGprValue(Context,4,2 << (*(byte *)&Context->Arch >> 4 & 3),
                          NVar11 - Operand_00->Size,'\0');
      uVar4 = *(ushort *)&Operand_00->Info;
    }
    if ((uVar4 >> 8 & 1) != 0) {
      SVar10 = 0;
      NVar11 = ShemuX86GetGprValue(Context,(uint)(*(byte *)((long)&Operand_00->Info + 10) >> 3),
                                   (uint)(Operand_00->Info).Memory.BaseSize,'\0');
      uVar17 = -(ulong)Operand_00->Size;
      if ((*(uint *)((long)&Context->Arch + 0x2f0) >> 10 & 1) == 0) {
        uVar17 = (ulong)Operand_00->Size;
      }
      ShemuX86SetGprValue(Context,(uint)(*(byte *)((long)&Operand_00->Info + 10) >> 3),
                          (uint)(Operand_00->Info).Memory.BaseSize,uVar17 + NVar11,'\0');
      goto switchD_00162bbd_caseD_3;
    }
    goto LAB_00163051;
  }
  if ((*(byte *)Operand_00 & 0xf) != 1) {
    SVar10 = 4;
    goto switchD_00162bbd_caseD_3;
  }
  NVar5 = (Operand_00->Info).Register.Type;
  SVar10 = 6;
  switch(NVar5) {
  case ND_REG_GPR:
    if ((((*(int *)((long)&Context->Arch + 0x1a8) == 0x6c4) &&
         ((Operand_00->Info).Register.Reg == 4)) &&
        (((uint)((Context->Arch).X86.Mode == '\x02') * 4 + 3 & (uint)(Value->Value).Qwords[0]) == 0)
        ) && ((NVar9 = ShemuIsShellcodePtr(Context,(Value->Value).Qwords[0],0x40), NVar9 != '\0' ||
              (NVar9 = ShemuIsStackPtr(Context,(Value->Value).Qwords[0],0x40), NVar9 != '\0')))) {
      pbVar1 = (byte *)((long)&Context->Flags + 1);
      *pbVar1 = *pbVar1 | 1;
    }
    ShemuX86SetGprValue(Context,(Operand_00->Info).Register.Reg,Operand_00->Size,
                        (Value->Value).Qwords[0],*(byte *)((long)&Operand_00->Info + 0xd) & 1);
    break;
  case ND_REG_SEG:
    uVar14 = (Operand_00->Info).Register.Reg;
    uVar4 = (Value->Value).Words[0];
    uVar13 = (uint)uVar4;
    if (((uVar4 != 0) || (uVar14 == 2)) || ((Context->Arch).X86.Mode != '\x02')) {
      SVar10 = 0xb;
      if ((char)((uVar13 & 4) >> 2) != '\0' || 0x7f < uVar4) goto switchD_00162bbd_caseD_3;
      NVar3 = (Context->Arch).X86.Ring;
      if (((uVar4 & 3) != 0 && NVar3 == '\0') || ((uVar13 & 3) != 3 && NVar3 == '\x03'))
      goto switchD_00162bbd_caseD_3;
    }
    SVar10 = 0;
    if (uVar14 < 6) {
      *(ulong *)((long)&Context->Arch + (ulong)uVar14 * 0x20 + 0x360) = (ulong)uVar13;
    }
  case ND_REG_FPU:
    goto switchD_00162bbd_caseD_3;
  case ND_REG_MMX:
    *(ND_UINT64 *)((long)&Context->Arch + (ulong)(Operand_00->Info).Register.Reg * 8 + 0x410) =
         (Value->Value).Qwords[0];
    if ((Context->Options & 1) != 0) {
      SVar10 = 0;
      shemu_internal_printf
                (Context,"        MM%d = 0x%016llx\n",(ulong)(Operand_00->Info).Register.Reg);
      goto switchD_00162bbd_caseD_3;
    }
    break;
  case ND_REG_SSE:
    n = 0x40;
    if (((undefined1  [3192])Context->Arch & (undefined1  [3192])0xf0000) == (undefined1  [3192])0x0
       ) {
      n = 0x10;
    }
    SVar10 = 0;
    nd_memset((void *)((long)&Context->Arch + (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450)
              ,0,n);
    shemu_memcpy((void *)((long)&Context->Arch +
                         (ulong)(Operand_00->Info).Register.Reg * 0x40 + 0x450),Value,
                 (ulong)Operand_00->Size);
    if ((Context->Options & 1) != 0) {
      uVar17 = (ulong)((Operand_00->Size != 0x20) + 0x59);
      if (Operand_00->Size == 0x10) {
        uVar17 = 0x58;
      }
      SVar10 = 0;
      shemu_internal_printf
                (Context,"        %cMM%d (HI_32) = 0x%016llx%016llx%016llx%016llx\n",uVar17,
                 (ulong)(Operand_00->Info).Register.Reg,(Value->Value).Qwords[7],
                 (Value->Value).Qwords[6],(Value->Value).Qwords[5],(Value->Value).Qwords[4]);
      uVar17 = (ulong)((Operand_00->Size != 0x20) + 0x59);
      if (Operand_00->Size == 0x10) {
        uVar17 = 0x58;
      }
      shemu_internal_printf
                (Context,"        %cMM%d (LO_32) = 0x%016llx%016llx%016llx%016llx\n",uVar17,
                 (ulong)(Operand_00->Info).Register.Reg,(Value->Value).Qwords[3],
                 (Value->Value).Qwords[2],(Value->Value).Qwords[1],(Value->Value).Qwords[0]);
    }
    goto switchD_00162bbd_caseD_3;
  case ND_REG_CR:
    switch((Operand_00->Info).Register.Reg) {
    case 0:
      (Context->Arch).X86.Registers.RegCr0 = (Value->Value).Qwords[0];
      break;
    default:
      goto switchD_00162bbd_caseD_3;
    case 2:
      (Context->Arch).X86.Registers.RegCr2 = (Value->Value).Qwords[0];
      break;
    case 3:
      (Context->Arch).X86.Registers.RegCr3 = (Value->Value).Qwords[0];
      break;
    case 4:
      (Context->Arch).X86.Registers.RegCr4 = (Value->Value).Qwords[0];
      break;
    case 8:
      (Context->Arch).X86.Registers.RegCr8 = (Value->Value).Qwords[0];
    }
    break;
  default:
    if (NVar5 == ND_REG_FLG) {
      if (Operand_00->Size == 2) {
        paVar8 = &Value->Value;
        Value = (SHEMU_VALUE *)&(Context->Arch).X86.Registers.RegFlags;
        *(ND_UINT16 *)((long)&Context->Arch + 0x2f0) = paVar8->Words[0];
      }
      (Context->Arch).X86.Registers.RegFlags =
           (ulong)((uint)(Value->Value).Qwords[0] & 0x3f7fd5) | 2;
    }
    else {
      if (NVar5 != ND_REG_RIP) goto switchD_00162bbd_caseD_3;
      cVar2 = (char)Value->Size;
      sVar7 = ((byte)(cVar2 * '\b') < 0x41) * (cVar2 * -8 + '@');
      (Context->Arch).X86.Registers.RegRip = ((Value->Value).Qwords[0] << sVar7) >> sVar7;
    }
  }
LAB_00163051:
  SVar10 = 0;
switchD_00162bbd_caseD_3:
  if (*(long *)(in_FS_OFFSET + 0x28) == lStack_38) {
    return SVar10;
  }
  __stack_chk_fail();
}

Assistant:

static SHEMU_STATUS
ShemuX86SetOperandValue(
    SHEMU_CONTEXT *Context,
    ND_UINT32 Operand,
    SHEMU_VALUE *Value
    )
{
    SHEMU_STATUS status;
    PND_OPERAND op = &Context->Arch.X86.Instruction.Operands[Operand];

    // If a stack address is being loaded, check if it points to a string built on the stack.
    if (ShemuIsStackPtr(Context, Value->Value.Qwords[0], Context->StrThreshold))
    {
        ND_UINT64 sptr = Value->Value.Qwords[0];
        ND_UINT32 i, stckstrlen = 0;

        // Check if a string was saved on the stack. Typically used by shellcodes like this:
        // PUSH str0
        // PUSH str1
        // ...
        // PUSH strn
        // Other variants may exist, but all we care about are stores on the stack, and all are checked.

        for (i = 0; i < Context->StrThreshold; i++)
        {
            unsigned char c;

            status = ShemuMemLoad(Context, sptr + i, 1, &c);
            if (SHEMU_SUCCESS != status)
            {
                break;
            }

            if ((c >= 'a' && c <= 'z') || (c >= 'A' && c <= 'Z') || (c >= '0' && c <= '9') ||
                c == '\\' || c == '/' || c == ':' || c == ' ')
            {
                stckstrlen++;
            }
            else
            {
                break;
            }
        }

        if (stckstrlen >= Context->StrThreshold)
        {
            Context->Flags |= SHEMU_FLAG_STACK_STR;
        }
    }


    if (op->Type == ND_OP_REG)
    {
        switch (op->Info.Register.Type)
        {
        case ND_REG_GPR:
            if (Context->Arch.X86.Instruction.Instruction == ND_INS_XCHG &&
                op->Info.Register.Reg == NDR_RSP &&
                ShemuX86IsAddressAligned(Context, Value->Value.Qwords[0]))
            {
                // Conditions for a STACK_PIVOT detection:
                // 1. The instruction is XCHG
                // 2. The value loaded in the RSP register is naturally aligned
                // 3. The value points either inside the shellcode or the stack area, and at least 64 bytes are valid
                if (ShemuIsShellcodePtr(Context, Value->Value.Qwords[0], 64) ||
                    ShemuIsStackPtr(Context, Value->Value.Qwords[0], 64))
                {
                    Context->Flags |= SHEMU_FLAG_STACK_PIVOT;
                }
            }

            ShemuX86SetGprValue(Context, op->Info.Register.Reg, op->Size, Value->Value.Qwords[0], 
                             op->Info.Register.IsHigh8);
            break;

        case ND_REG_SEG:
            if (!ShemuX86IsSelectorValid(Context, op->Info.Register.Reg, Value->Value.Words[0]))
            {
                return SHEMU_ABORT_INVALID_SELECTOR;
            }
            ShemuX86SetSegValue(Context, op->Info.Register.Reg, Value->Value.Words[0]);
            break;

        case ND_REG_MMX:
            Context->Arch.X86.MmxRegisters[op->Info.Register.Reg] = Value->Value.Qwords[0];
            // Only log these when they're written.
            if (Context->Options & SHEMU_OPT_TRACE_EMULATION)
            {
                shemu_printf(Context, "        MM%d = 0x%016llx\n", op->Info.Register.Reg, Value->Value.Qwords[0]);
            }
            break;

        case ND_REG_SSE:
            if (Context->Arch.X86.Instruction.EncMode != ND_ENCM_LEGACY)
            {
                // Zero the entire register first, if we have a VEX/EVEX encoded instruction.
                nd_memzero(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg], ND_MAX_REGISTER_SIZE);
            }
            else
            {
                // Zero upper bits in the 128 bits register, if operand size is less than 16 bytes.
                // Upper bits in the YMM/ZMM register are preserved.
                nd_memzero(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg], 16);
            }
            // Copy the value.
            shemu_memcpy(&Context->Arch.X86.SseRegisters[op->Info.Register.Reg],
                         Value->Value.Bytes, 
                         op->Size);
            // Only log these when they're written.
            if (Context->Options & SHEMU_OPT_TRACE_EMULATION)
            {
                shemu_printf(Context,
                             "        %cMM%d (HI_32) = 0x%016llx%016llx%016llx%016llx\n",
                             op->Size == 16 ? 'X' : op->Size == 32 ? 'Y' : 'Z', op->Info.Register.Reg,
                             Value->Value.Qwords[7], Value->Value.Qwords[6], 
                             Value->Value.Qwords[5], Value->Value.Qwords[4]);
                shemu_printf(Context,
                             "        %cMM%d (LO_32) = 0x%016llx%016llx%016llx%016llx\n",
                             op->Size == 16 ? 'X' : op->Size == 32 ? 'Y' : 'Z', op->Info.Register.Reg,
                             Value->Value.Qwords[3], Value->Value.Qwords[2], 
                             Value->Value.Qwords[1], Value->Value.Qwords[0]);
            }
            break;

        case ND_REG_RIP:
            Context->Arch.X86.Registers.RegRip = ND_TRIM(Value->Size, Value->Value.Qwords[0]);
            break;

        case ND_REG_FLG:
            if (op->Size == 2)
            {
                *((ND_UINT16*)&Context->Arch.X86.Registers.RegFlags) = Value->Value.Words[0];
            }
            else
            {
                Context->Arch.X86.Registers.RegFlags = Value->Value.Qwords[0];
            }
            // Handle reserved bits.
            Context->Arch.X86.Registers.RegFlags |= (1ULL << 1);
            Context->Arch.X86.Registers.RegFlags &= ~((1ULL << 3) | (1ULL << 5) | (1ULL << 15));
            Context->Arch.X86.Registers.RegFlags &= 0x3FFFFF;
            break;

        case ND_REG_CR:
            switch (op->Info.Register.Reg)
            {
            case NDR_CR0:
                Context->Arch.X86.Registers.RegCr0 = Value->Value.Qwords[0];
                break;
            case NDR_CR2:
                Context->Arch.X86.Registers.RegCr2 = Value->Value.Qwords[0];
                break;
            case NDR_CR3:
                Context->Arch.X86.Registers.RegCr3 = Value->Value.Qwords[0];
                break;
            case NDR_CR4:
                Context->Arch.X86.Registers.RegCr4 = Value->Value.Qwords[0];
                break;
            case NDR_CR8:
                Context->Arch.X86.Registers.RegCr8 = Value->Value.Qwords[0];
                break;
            default:
                return SHEMU_ABORT_REGISTER_NOT_SUPPORTED;
            }
            break;

        default:
            return SHEMU_ABORT_REGISTER_NOT_SUPPORTED;
        }
    }
    else if (op->Type == ND_OP_MEM)
    {
        // Compute the GLA.
        ND_UINT64 gla = ShemuX86ComputeLinearAddress(Context, op);

        // Handle self-write. We store a 1 for each written byte inside the shellcode space. Once the modified bytes
        // are executed, we can trigger the self-write detection.
        if (ShemuIsShellcodePtr(Context, gla, op->Size))
        {
            ShemuShellBmpStateSet(Context, gla - Context->ShellcodeBase, op->Size, SHELL_BYTE_DIRTY);
        }

        // Handle RIP save on the stack.
        if (ShemuIsStackPtr(Context, gla, MAX(op->Size, Context->Arch.X86.Instruction.WordLength)))
        {
            // Note: only Context->Arch.X86.Instruction.WordLength bits are flagged as RIP, as that is the RIP size.
            if (Context->Arch.X86.Instruction.Instruction == ND_INS_CALLNR ||
                Context->Arch.X86.Instruction.Instruction == ND_INS_CALLNI)
            {
                ShemuStackBmpStateSet(Context, gla - Context->StackBase, 
                                      Context->Arch.X86.Instruction.WordLength, STACK_BYTE_RIP);
            }
            else if (Context->Arch.X86.Instruction.Instruction == ND_INS_FNSTENV)
            {
                // OK: op->Size will be the FPU state size (28 bytes); we only emulate 32 & 64 bit forms, the RIP is 
                // always 4 bytes.
                ShemuStackBmpStateSet(Context, (gla + 0xC) - Context->StackBase, 
                                      MIN(Context->Arch.X86.Instruction.WordLength, 4), STACK_BYTE_RIP);
            }
            else if (Context->Arch.X86.Instruction.Instruction == ND_INS_FXSAVE || 
                Context->Arch.X86.Instruction.Instruction == ND_INS_FXSAVE64)
            {
                // OK: op->Size will be the FXSAVE size (512 bytes).
                ShemuStackBmpStateSet(Context, (gla + 0x8) - Context->StackBase, 
                                      Context->Arch.X86.Instruction.WordLength, STACK_BYTE_RIP);
            }
            else
            {
                // Something is written on a previously saved RIP; reset it.
                ShemuStackBmpStateClear(Context, gla - Context->StackBase, op->Size, STACK_BYTE_RIP);
            }
        }

        // Set the value.
        status = ShemuMemStore(Context, gla, MIN(op->Size, Value->Size), Value->Value.Bytes);
        if (SHEMU_SUCCESS != status)
        {
            return status;
        }

        if (Context->Options & SHEMU_OPT_TRACE_MEMORY)
        {
            ShemuDisplayMemValue(Context, gla, Value->Size, Value->Value.Bytes, ND_FALSE);
        }

        // If this is a stack access, we need to update the stack pointer.
        if (op->Info.Memory.IsStack)
        {
            ND_UINT64 regval = ShemuX86GetGprValue(Context, NDR_RSP, (2 << Context->Arch.X86.Instruction.DefStack), ND_FALSE);

            regval -= op->Size;

            ShemuX86SetGprValue(Context, NDR_RSP, (2 << Context->Arch.X86.Instruction.DefStack), regval, ND_FALSE);
        }

        // If this is a string operation, make sure we update RSI/RDI.
        if (op->Info.Memory.IsString)
        {
            ND_UINT64 regval = ShemuX86GetGprValue(Context, op->Info.Memory.Base, op->Info.Memory.BaseSize, ND_FALSE);

            regval = GET_FLAG(Context, NDR_RFLAG_DF) ? regval - op->Size : regval + op->Size;

            ShemuX86SetGprValue(Context, op->Info.Memory.Base, op->Info.Memory.BaseSize, regval, ND_FALSE);
        }
    }
    else
    {
        return SHEMU_ABORT_OPERAND_NOT_SUPPORTED;
    }

    return SHEMU_SUCCESS;
}